

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_add_text_sized(LodePNGInfo *info,char *key,char *str,size_t size)

{
  size_t sVar1;
  char **ppcVar2;
  char **ppcVar3;
  char *pcVar4;
  uint uVar5;
  
  ppcVar2 = (char **)realloc(info->text_keys,info->text_num * 8 + 8);
  ppcVar3 = (char **)realloc(info->text_strings,info->text_num * 8 + 8);
  if (ppcVar2 != (char **)0x0) {
    info->text_keys = ppcVar2;
  }
  if (ppcVar3 != (char **)0x0) {
    info->text_strings = ppcVar3;
  }
  uVar5 = 0x53;
  if (ppcVar2 != (char **)0x0 && ppcVar3 != (char **)0x0) {
    info->text_num = info->text_num + 1;
    pcVar4 = alloc_string(key);
    sVar1 = info->text_num;
    info->text_keys[sVar1 - 1] = pcVar4;
    pcVar4 = (char *)malloc(size + 1);
    if (pcVar4 != (char *)0x0) {
      if (size != 0) {
        memcpy(pcVar4,str,size);
      }
      pcVar4[size] = '\0';
    }
    info->text_strings[sVar1 - 1] = pcVar4;
    if ((info->text_keys[sVar1 - 1] != (char *)0x0) &&
       (uVar5 = 0x53, info->text_strings[sVar1 - 1] != (char *)0x0)) {
      uVar5 = 0;
    }
  }
  return uVar5;
}

Assistant:

static unsigned lodepng_add_text_sized(LodePNGInfo* info, const char* key, const char* str, size_t size) {
  char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));

  if (new_keys) info->text_keys = new_keys;
  if (new_strings) info->text_strings = new_strings;

  if (!new_keys || !new_strings) return 83; /*alloc fail*/

  ++info->text_num;
  info->text_keys[info->text_num - 1] = alloc_string(key);
  info->text_strings[info->text_num - 1] = alloc_string_sized(str, size);
  if (!info->text_keys[info->text_num - 1] || !info->text_strings[info->text_num - 1]) return 83; /*alloc fail*/

  return 0;
}